

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<int,_int,_0U>::insert
          (IntervalMap<int,_int,_0U> *this,int left,int right,int *value,allocator_type *alloc)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t uVar7;
  iterator it;
  const_iterator local_68;
  
  if (this->height == 0) {
    uVar3 = this->rootSize;
    uVar4 = uVar3;
    uVar5 = uVar3;
    if ((ulong)uVar3 == 0) {
joined_r0x004f4489:
      while (uVar5 != uVar4) {
        uVar1 = uVar4 - 1;
        *(undefined8 *)((long)&this->field_0 + (ulong)uVar4 * 8) =
             *(undefined8 *)((long)&this->field_0 + (ulong)uVar1 * 8);
        *(undefined4 *)((long)&this->field_0 + (ulong)uVar4 * 4 + 0x80) =
             *(undefined4 *)((long)&this->field_0 + (ulong)uVar1 * 4 + 0x80);
        uVar4 = uVar1;
      }
      *(ulong *)((long)&this->field_0 + (ulong)uVar5 * 8) = CONCAT44(right,left);
      *(int *)((long)&this->field_0 + (ulong)uVar5 * 4 + 0x80) = *value;
      uVar7 = uVar3 + 1;
    }
    else {
      if (uVar3 == 0x10) goto LAB_004f4404;
      uVar6 = 0;
      do {
        if (left <= *(int *)((long)&this->field_0 + uVar6 * 8)) goto LAB_004f447d;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
      uVar6 = (ulong)uVar3;
LAB_004f447d:
      uVar7 = 0x11;
      uVar5 = (uint)uVar6;
      if (uVar5 != 0x10) goto joined_r0x004f4489;
    }
    this->rootSize = uVar7;
  }
  else {
LAB_004f4404:
    pcVar2 = local_68.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
             firstElement;
    local_68.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = 0;
    local_68.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.cap = 2;
    local_68.map = this;
    local_68.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ =
         (pointer)pcVar2;
    const_iterator::setToFind(&local_68,left,right);
    iterator::insert((iterator *)&local_68,left,right,value,alloc);
    if (local_68.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
        (pointer)pcVar2) {
      operator_delete(local_68.path.path.
                      super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
    }
  }
  return;
}

Assistant:

void insert(TKey left, TKey right, const TValue& value, allocator_type& alloc) {
        if (isFlat() && rootSize != RootLeaf::Capacity) {
            uint32_t i = rootLeaf.find(rootSize, {left, right});
            rootSize = rootLeaf.insertFrom(i, rootSize, {left, right}, value);
        }
        else {
            iterator it(*this);
            it.setToFind(left, right);
            it.insert(left, right, value, alloc);
        }
    }